

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_cpc.cpp
# Opt level: O0

void dirSAVECPR(void)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  int local_48;
  int local_44;
  aint val;
  int cprSize;
  undefined1 local_30 [8];
  path fnaam;
  
  if (pass != 3) {
    SkipToEol(&lp);
    return;
  }
  bVar1 = IsAmstradPLUSDevice(DeviceID);
  if (!bVar1) {
    Error("[SAVECPR] is allowed only in AMSTRADCPCPLUS device mode",(char *)0x0,SUPPRESS);
    return;
  }
  GetOutputFileName_abi_cxx11_((path *)local_30,&lp);
  uVar3 = std::filesystem::__cxx11::path::has_filename();
  if ((uVar3 & 1) == 0) {
    Error("[SAVECPR] CPR file name is empty",(char *)0x0,SUPPRESS);
    val = 1;
    goto LAB_0011c63c;
  }
  local_44 = 0x20;
  bVar1 = anyComma(&lp);
  if (bVar1) {
    iVar2 = SkipBlanks();
    if (iVar2 != 0) {
      Error(err_txt_size,(char *)0x0,SUPPRESS);
    }
    iVar2 = ParseExpression(&lp,&local_48);
    if (iVar2 == 0) {
      val = 1;
      goto LAB_0011c63c;
    }
    if ((local_48 < 1) || (0x20 < local_48)) {
      Error(err_txt_size,(char *)0x0,SUPPRESS);
      val = 1;
      goto LAB_0011c63c;
    }
    local_44 = local_48;
  }
  iVar2 = SaveCPR((path *)local_30,local_44);
  if (iVar2 == 0) {
    Error("[SAVECPR] Error writing file (Disk full?)",(char *)0x0,IF_FIRST);
  }
  val = 0;
LAB_0011c63c:
  std::filesystem::__cxx11::path::~path((path *)local_30);
  return;
}

Assistant:

void dirSAVECPR() {
	if (pass != LASTPASS) {
		SkipToEol(lp);
		return;
	}
	if (!IsAmstradPLUSDevice(DeviceID)) {
		Error("[SAVECPR] is allowed only in AMSTRADCPCPLUS device mode", NULL, SUPPRESS);
		return;
	}
	const std::filesystem::path fnaam = GetOutputFileName(lp);
	if (!fnaam.has_filename()) {
		Error("[SAVECPR] CPR file name is empty", NULL, SUPPRESS);
		return;
	}
	int cprSize = 32;
	if (anyComma(lp)) {
		if (SkipBlanks()) Error(err_txt_size, NULL, SUPPRESS);	// return will happen on ParseExpression
		aint val;
		if (!ParseExpression(lp, val)) return;
		if ((val < 1) || (val > 32)) {
			Error(err_txt_size, NULL, SUPPRESS);
			return;
		}
		cprSize = val;
	}
	if (!SaveCPR(fnaam, cprSize)) Error("[SAVECPR] Error writing file (Disk full?)", NULL, IF_FIRST);
}